

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorbase.h
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::operator*(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *__return_storage_ptr__,
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *vec)

{
  pointer pnVar1;
  pointer pnVar2;
  cpp_dec_float<200U,_int,_void> *v;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  cpp_dec_float<200U,_int,_void> *pcVar7;
  cpp_dec_float<200U,_int,_void> *pcVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  long lVar10;
  byte bVar11;
  fpclass_type fVar12;
  int32_t iVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar11 = 0;
  local_138.fpclass = cpp_dec_float_finite;
  local_138.prec_elem = 0x1c;
  local_138.data._M_elems[0] = 0;
  local_138.data._M_elems[1] = 0;
  local_138.data._M_elems[2] = 0;
  local_138.data._M_elems[3] = 0;
  local_138.data._M_elems[4] = 0;
  local_138.data._M_elems[5] = 0;
  local_138.data._M_elems[6] = 0;
  local_138.data._M_elems[7] = 0;
  local_138.data._M_elems[8] = 0;
  local_138.data._M_elems[9] = 0;
  local_138.data._M_elems[10] = 0;
  local_138.data._M_elems[0xb] = 0;
  local_138.data._M_elems[0xc] = 0;
  local_138.data._M_elems[0xd] = 0;
  local_138.data._M_elems[0xe] = 0;
  local_138.data._M_elems[0xf] = 0;
  local_138.data._M_elems[0x10] = 0;
  local_138.data._M_elems[0x11] = 0;
  local_138.data._M_elems[0x12] = 0;
  local_138.data._M_elems[0x13] = 0;
  local_138.data._M_elems[0x14] = 0;
  local_138.data._M_elems[0x15] = 0;
  local_138.data._M_elems[0x16] = 0;
  local_138.data._M_elems[0x17] = 0;
  local_138.data._M_elems[0x18] = 0;
  local_138.data._M_elems[0x19] = 0;
  local_138.data._M_elems._104_5_ = 0;
  local_138.data._M_elems[0x1b]._1_3_ = 0;
  local_138.exp = 0;
  local_138.neg = false;
  uVar4 = (uint)((ulong)((long)(this->val).
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 7);
  if ((int)uVar4 < 1) {
    fVar12 = cpp_dec_float_finite;
    iVar13 = 0x1c;
    local_138.neg = false;
    local_138.exp = 0;
  }
  else {
    uVar5 = (ulong)(uVar4 & 0x7fffffff);
    lVar6 = 0;
    lVar10 = 0;
    do {
      pnVar1 = (this->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)&(pnVar1->m_backend).data + lVar6);
      pnVar2 = (vec->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_b8.fpclass = cpp_dec_float_finite;
      local_b8.prec_elem = 0x1c;
      local_b8.data._M_elems[0] = 0;
      local_b8.data._M_elems[1] = 0;
      local_b8.data._M_elems[2] = 0;
      local_b8.data._M_elems[3] = 0;
      local_b8.data._M_elems[4] = 0;
      local_b8.data._M_elems[5] = 0;
      local_b8.data._M_elems[6] = 0;
      local_b8.data._M_elems[7] = 0;
      local_b8.data._M_elems[8] = 0;
      local_b8.data._M_elems[9] = 0;
      local_b8.data._M_elems[10] = 0;
      local_b8.data._M_elems[0xb] = 0;
      local_b8.data._M_elems[0xc] = 0;
      local_b8.data._M_elems[0xd] = 0;
      local_b8.data._M_elems[0xe] = 0;
      local_b8.data._M_elems[0xf] = 0;
      local_b8.data._M_elems[0x10] = 0;
      local_b8.data._M_elems[0x11] = 0;
      local_b8.data._M_elems[0x12] = 0;
      local_b8.data._M_elems[0x13] = 0;
      local_b8.data._M_elems[0x14] = 0;
      local_b8.data._M_elems[0x15] = 0;
      local_b8.data._M_elems[0x16] = 0;
      local_b8.data._M_elems[0x17] = 0;
      local_b8.data._M_elems[0x18] = 0;
      local_b8.data._M_elems[0x19] = 0;
      local_b8.data._M_elems._104_5_ = 0;
      local_b8.data._M_elems[0x1b]._1_3_ = 0;
      local_b8.exp = 0;
      local_b8.neg = false;
      v = pcVar7;
      if (((cpp_dec_float<200U,_int,_void> *)((long)&(pnVar2->m_backend).data + lVar6) != &local_b8)
         && (v = &pnVar2[lVar10].m_backend, pcVar7 != &local_b8)) {
        pcVar8 = &local_b8;
        for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
          (pcVar8->data)._M_elems[0] = (pcVar7->data)._M_elems[0];
          pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar11 * -8 + 4);
          pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar11 * -8 + 4);
        }
        local_b8.exp = *(int *)((long)&(pnVar1->m_backend).data + lVar6 + 0x70);
        local_b8.neg = *(bool *)((long)&(pnVar1->m_backend).data + lVar6 + 0x74);
        local_b8._120_8_ = *(undefined8 *)((long)&(pnVar1->m_backend).data + lVar6 + 0x78);
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=(&local_b8,v);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&local_138,&local_b8);
      lVar10 = lVar10 + 1;
      lVar6 = lVar6 + 0x80;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    fVar12 = local_138.fpclass;
    iVar13 = local_138.prec_elem;
  }
  pcVar7 = &local_138;
  pnVar9 = __return_storage_ptr__;
  for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pnVar9->m_backend).data._M_elems[0] = (pcVar7->data)._M_elems[0];
    pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + ((ulong)bVar11 * -2 + 1) * 4);
    pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar9 + ((ulong)bVar11 * -2 + 1) * 4);
  }
  (__return_storage_ptr__->m_backend).exp = local_138.exp;
  (__return_storage_ptr__->m_backend).neg = local_138.neg;
  (__return_storage_ptr__->m_backend).fpclass = fVar12;
  (__return_storage_ptr__->m_backend).prec_elem = iVar13;
  return __return_storage_ptr__;
}

Assistant:

R operator*(const VectorBase<R>& vec) const
   {
      StableSum<R> x;

      auto dimen = dim();

      for(decltype(dimen) i = 0; i < dimen; i++)
         x += val[i] * vec.val[i];

      return x;
   }